

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O3

Matrix<double,__1,_1,_0,__1,_1> __thiscall
lf::assemble::
AssembleVectorLocally<Eigen::Matrix<double,_1,1,0,_1,1>,lf::uscalfe::LinearFELocalLoadVector<double,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>&>>
          (assemble *this,dim_t codim,DofHandler *dof_handler,
          LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>
          *entity_vector_provider)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Index extraout_RDX;
  ActualDstType actualDst;
  double __tmp;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Matrix<double,__1,_1,_0,__1,_1> MVar10;
  scalar_constant_op<double> local_40;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_38;
  
  uVar4 = (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,(ulong)uVar4);
  local_40.m_other = 0.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp(&local_38,*(Index *)(this + 8),1,&local_40);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_38,
             (assign_op<double,_double> *)&local_40);
  auVar3 = _DAT_0030f0a0;
  auVar2 = _DAT_0030f090;
  if (0 < *(long *)(this + 8)) {
    lVar1 = *(long *)this;
    uVar5 = *(long *)(this + 8) + 0x1fffffffffffffff;
    uVar6 = uVar5 & 0x1fffffffffffffff;
    auVar8._8_4_ = (int)uVar6;
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = (int)(uVar6 >> 0x20);
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0030f0a0;
    do {
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9 = (auVar9 | auVar2) ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                  auVar8._4_4_ < auVar9._4_4_) & 1)) {
        *(double *)(lVar1 + lVar7 * 8) = local_38.m_functor.m_other;
      }
      if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
          auVar9._12_4_ <= auVar8._12_4_) {
        *(double *)(lVar1 + 8 + lVar7 * 8) = local_38.m_functor.m_other;
      }
      lVar7 = lVar7 + 2;
    } while ((uVar6 - ((uint)uVar5 & 1)) + 2 != lVar7);
  }
  AssembleVectorLocally<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_lf::uscalfe::LinearFELocalLoadVector<double,_lf::mesh::utils::MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>_&>_>
            (codim,dof_handler,entity_vector_provider,(Matrix<double,__1,_1,_0,__1,_1> *)this);
  MVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,__1,_1,_0,__1,_1>)
         MVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VECTOR AssembleVectorLocally(dim_t codim, const DofHandler &dof_handler,
                             ENTITY_VECTOR_PROVIDER &entity_vector_provider) {
  // Allocated vector holding r.h.s. vector to be assembled
  VECTOR resultvector{dof_handler.NumDofs()};
  // Initialize to zero: assembly of new vector
  resultvector.setZero();
  // Perform actual assembly
  AssembleVectorLocally<VECTOR, ENTITY_VECTOR_PROVIDER>(
      codim, dof_handler, entity_vector_provider, resultvector);
  return resultvector;
}